

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

int __thiscall
pbrt::SampleDiscrete(pbrt *this,span<const_float> weights,Float u,Float *pmf,Float *uRemapped)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  float *pfVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  long in_FS_OFFSET;
  float local_34;
  
  pfVar6 = (float *)weights.n;
  pfVar8 = weights.ptr;
  if (pfVar8 == (float *)0x0) {
    iVar7 = -1;
    if (pfVar6 != (float *)0x0) {
      *pfVar6 = 0.0;
    }
  }
  else {
    fVar2 = 0.0;
    for (lVar5 = 0; (long)pfVar8 * 4 - lVar5 != 0; lVar5 = lVar5 + 4) {
      fVar2 = fVar2 + *(float *)(this + lVar5);
    }
    pfVar9 = (float *)0x0;
    for (local_34 = u;
        (pfVar10 = pfVar8, pfVar8 != pfVar9 &&
        (lVar5 = (long)pfVar9 * 4, pfVar10 = pfVar9, *(float *)(this + lVar5) / fVar2 <= local_34));
        local_34 = local_34 - *(float *)(this + lVar5) / fVar2) {
      pfVar9 = (float *)((long)pfVar9 + 1);
    }
    iVar7 = (int)pfVar10;
    if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
       (iVar4 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
                                     reg), iVar4 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg
                 ,SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
                  {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
    }
    *(long *)(in_FS_OFFSET + -0x610) = *(long *)(in_FS_OFFSET + -0x610) + 1;
    if (pfVar10 == pfVar8) {
      *(long *)(in_FS_OFFSET + -0x618) = *(long *)(in_FS_OFFSET + -0x618) + 1;
      iVar7 = (int)weights.ptr + -1;
    }
    fVar1 = *(float *)(this + (long)iVar7 * 4);
    if (pfVar6 != (float *)0x0) {
      *pfVar6 = fVar1 / fVar2;
    }
    if (pmf != (Float *)0x0) {
      auVar3 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(local_34 / (fVar1 / fVar2)))
                         );
      *pmf = auVar3._0_4_;
    }
  }
  return iVar7;
}

Assistant:

PBRT_CPU_GPU inline int SampleDiscrete(pstd::span<const Float> weights, Float u,
                                       Float *pmf, Float *uRemapped) {
    // Handle empty _weights_ for discrete sampling
    if (weights.empty()) {
        if (pmf != nullptr)
            *pmf = 0;
        return -1;
    }

    // Compute sum of _weights_
    Float sumWeights = 0;
    for (Float w : weights)
        sumWeights += w;

    // Find offset in _weights_ corresponding to _u_
    int offset = 0;
    while (offset < weights.size() && u >= weights[offset] / sumWeights) {
        u -= weights[offset] / sumWeights;
        ++offset;
    }
    CHECK_RARE(1e-6, offset == weights.size());
    if (offset == weights.size())
        offset = weights.size() - 1;

    // Compute PMF and remapped _u_ value, if necessary
    Float p = weights[offset] / sumWeights;
    if (pmf != nullptr)
        *pmf = p;
    if (uRemapped != nullptr)
        *uRemapped = std::min(u / p, OneMinusEpsilon);

    return offset;
}